

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O2

int netaddr_to_binary(void *dst,netaddr *src,size_t len)

{
  byte bVar1;
  int iVar2;
  
  bVar1 = netaddr_get_af_maxprefix((uint)src->_type);
  iVar2 = -1;
  if ((7 < bVar1) && (bVar1 >> 3 <= len)) {
    memcpy(dst,src,(ulong)(bVar1 >> 3));
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
netaddr_to_binary(void *dst, const struct netaddr *src, size_t len) {
  uint32_t addr_len;

  addr_len = netaddr_get_maxprefix(src) >> 3;
  if (addr_len == 0 || len < addr_len) {
    /* unknown address type */
    return -1;
  }

  memcpy(dst, src->_addr, addr_len);
  return 0;
}